

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::unit_to_the_power_of(string *unit_string,int power,uint64_t match_flags)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  double extraout_RAX;
  double extraout_RAX_00;
  size_t sVar5;
  double extraout_RAX_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double in_XMM1_Qa;
  precise_unit pVar8;
  string local_1a8;
  string *local_188;
  double local_180;
  allocator local_171;
  string local_170;
  size_t local_150;
  size_t fnd;
  double local_140;
  string local_138;
  undefined1 local_118 [8];
  precise_unit a_unit;
  string local_e0;
  string *local_c0;
  double dStack_b8;
  string local_a0;
  string *local_80;
  double dStack_78;
  string local_70 [8];
  string ustring;
  int index;
  bool partialPowerSegment;
  precise_unit retunit;
  uint32_t recursion_modifier;
  uint64_t match_flags_local;
  int power_local;
  string *unit_string_local;
  double local_10;
  
  retunit.commodity_ = 0x8000;
  if ((match_flags & 0x20000) != 0) {
    retunit.commodity_ = 0;
  }
  _index = (string *)0x7ff4000000000000;
  retunit.multiplier_ = 2.07707442941207e-314;
  pcVar3 = (char *)std::__cxx11::string::back();
  ustring.field_2._M_local_buf[0xf] = *pcVar3 == ')';
  iVar2 = std::__cxx11::string::size();
  ustring.field_2._8_4_ = iVar2 + -2;
  if ((((ustring.field_2._M_local_buf[0xf] & 1U) != 0) &&
      (segmentcheckReverse(unit_string,'(',(int *)(ustring.field_2._M_local_buf + 8)),
      0 < (int)ustring.field_2._8_4_)) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)unit_string), *pcVar3 == '^')) {
    ustring.field_2._M_local_buf[0xf] = '\0';
  }
  if ((ustring.field_2._M_local_buf[0xf] & 1U) == 0) {
    if ((match_flags & 0x200) != 0) {
      cleanUnitString(unit_string,match_flags);
    }
    pVar8 = get_unit(unit_string,match_flags);
    local_140 = pVar8._8_8_;
    fnd = (size_t)pVar8.multiplier_;
    _index = (string *)fnd;
    retunit.multiplier_ = local_140;
    bVar1 = is_valid((precise_unit *)&index);
    if (bVar1) {
      if (power == 1) {
        unit_string_local = _index;
        local_10 = retunit.multiplier_;
      }
      else if (power == -1) {
        pVar8 = precise_unit::inv((precise_unit *)&index);
        local_10 = pVar8._8_8_;
        unit_string_local = (string *)pVar8.multiplier_;
      }
      else {
        unit_string_local =
             (string *)
             precise_unit::pow((precise_unit *)&index,
                               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),in_XMM1_Qa)
        ;
        local_10 = extraout_RAX_00;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,"per",&local_171);
      sVar5 = findWordOperatorSep(unit_string,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      if (sVar5 == 0xffffffffffffffff) {
        local_150 = sVar5;
        std::__cxx11::string::string((string *)&local_1a8,(string *)unit_string);
        pVar8 = unit_from_string_internal(&local_1a8,match_flags - retunit.commodity_);
        local_180 = pVar8._8_8_;
        local_188 = (string *)pVar8.multiplier_;
        _index = local_188;
        retunit.multiplier_ = local_180;
        std::__cxx11::string::~string((string *)&local_1a8);
        bVar1 = is_valid((precise_unit *)&index);
        if (bVar1) {
          if (power == 1) {
            unit_string_local = _index;
            local_10 = retunit.multiplier_;
          }
          else if (power == -1) {
            pVar8 = precise_unit::inv((precise_unit *)&index);
            local_10 = pVar8._8_8_;
            unit_string_local = (string *)pVar8.multiplier_;
          }
          else {
            unit_string_local =
                 (string *)
                 precise_unit::pow((precise_unit *)&index,
                                   (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02),
                                   in_XMM1_Qa);
            local_10 = extraout_RAX_01;
          }
        }
        else {
          unit_string_local = (string *)0x7ff4000000000000;
          local_10 = 2.07707442941207e-314;
        }
      }
      else {
        unit_string_local = (string *)0x3ff0000000000000;
        local_10 = 3.97874210805989e-315;
      }
    }
    goto LAB_001a30ad;
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_70,(ulong)unit_string);
  std::__cxx11::string::string((string *)&local_a0,local_70);
  pVar8 = unit_from_string_internal(&local_a0,match_flags - retunit.commodity_);
  dStack_78 = pVar8._8_8_;
  local_80 = (string *)pVar8.multiplier_;
  _index = local_80;
  retunit.multiplier_ = dStack_78;
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = is_valid((precise_unit *)&index);
  uVar6 = extraout_XMM0_Da;
  uVar7 = extraout_XMM0_Db;
  if (bVar1) {
LAB_001a2c0a:
    if (power == -1) {
      pVar8 = precise_unit::inv((precise_unit *)&index);
      retunit.multiplier_ = pVar8._8_8_;
      _index = (string *)pVar8.multiplier_;
    }
    else if (power != 1) {
      a_unit._8_8_ = precise_unit::pow((precise_unit *)&index,(double)CONCAT44(uVar7,uVar6),
                                       in_XMM1_Qa);
      _index = (string *)a_unit._8_8_;
      retunit.multiplier_ = extraout_RAX;
    }
    if ((int)ustring.field_2._8_4_ < 0) {
      unit_string_local = _index;
      local_10 = retunit.multiplier_;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_138,(ulong)unit_string);
      pVar8 = unit_from_string_internal(&local_138,match_flags - retunit.commodity_);
      a_unit.multiplier_ = pVar8._8_8_;
      local_118 = (undefined1  [8])pVar8.multiplier_;
      std::__cxx11::string::~string((string *)&local_138);
      bVar1 = is_error((precise_unit *)local_118);
      if (bVar1) {
        unit_string_local = (string *)0x3ff0000000000000;
        local_10 = 3.97874210805989e-315;
      }
      else {
        pVar8 = precise_unit::operator*((precise_unit *)local_118,(precise_unit *)&index);
        local_10 = pVar8._8_8_;
        unit_string_local = (string *)pVar8.multiplier_;
      }
    }
  }
  else if ((int)ustring.field_2._8_4_ < 0) {
    unit_string_local = (string *)0x7ff4000000000000;
    local_10 = 2.07707442941207e-314;
  }
  else {
    lVar4 = std::__cxx11::string::find_first_of((char *)local_70,0x1d69e7);
    if (lVar4 == -1) {
      std::__cxx11::string::string((string *)&local_e0,(string *)unit_string);
      pVar8 = unit_from_string_internal(&local_e0,match_flags - retunit.commodity_);
      dStack_b8 = pVar8._8_8_;
      local_c0 = (string *)pVar8.multiplier_;
      _index = local_c0;
      retunit.multiplier_ = dStack_b8;
      std::__cxx11::string::~string((string *)&local_e0);
      bVar1 = is_valid((precise_unit *)&index);
      if (bVar1) {
        ustring.field_2._8_4_ = 0xffffffff;
        uVar6 = extraout_XMM0_Da_00;
        uVar7 = extraout_XMM0_Db_00;
        goto LAB_001a2c0a;
      }
      unit_string_local = (string *)0x7ff4000000000000;
      local_10 = 2.07707442941207e-314;
    }
    else {
      unit_string_local = (string *)0x7ff4000000000000;
      local_10 = 2.07707442941207e-314;
    }
  }
  std::__cxx11::string::~string(local_70);
LAB_001a30ad:
  pVar8._8_8_ = local_10;
  pVar8.multiplier_ = (double)unit_string_local;
  return pVar8;
}

Assistant:

static precise_unit unit_to_the_power_of(
    std::string unit_string,
    int power,
    std::uint64_t match_flags)
{
    std::uint32_t recursion_modifier = recursion_depth1;
    if ((match_flags & no_recursion) != 0) {
        recursion_modifier = 0;
    }

    precise_unit retunit = precise::invalid;
    bool partialPowerSegment = (unit_string.back() == ')');
    int index = static_cast<int>(unit_string.size() - 2);
    if (partialPowerSegment) {
        segmentcheckReverse(unit_string, '(', index);
        if (index > 0 && unit_string[index] == '^') {
            partialPowerSegment = false;
        }
    }
    if (partialPowerSegment) {
        std::string ustring = unit_string.substr(
            static_cast<size_t>(index) + 2,
            unit_string.size() - static_cast<size_t>(index) - 3);
        retunit = unit_from_string_internal(
            ustring, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            if (index >= 0) {
                if (ustring.find_first_of("(*/^{[") == std::string::npos) {
                    retunit = unit_from_string_internal(
                        unit_string, match_flags - recursion_modifier);
                    if (!is_valid(retunit)) {
                        return precise::invalid;
                    }
                    index = -1;
                } else {
                    return precise::invalid;
                }
            } else {
                return precise::invalid;
            }
        }

        if (power == -1) {
            retunit = retunit.inv();
        } else if (power != 1) {
            retunit = retunit.pow(power);
        }

        if (index < 0) {
            return retunit;
        }
        auto a_unit = unit_from_string_internal(
            unit_string.substr(0, index), match_flags - recursion_modifier);
        if (!is_error(a_unit)) {
            return a_unit * retunit;
        }
        return precise::defunit;
    }
    // auto ustring = unit_string.substr(0, pchar + 1);

    if ((match_flags & case_insensitive) != 0) {
        cleanUnitString(unit_string, match_flags);
    }

    retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    auto fnd = findWordOperatorSep(unit_string, "per");
    if (fnd == std::string::npos) {
        retunit = unit_from_string_internal(
            unit_string, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            return precise::invalid;
        }
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    return precise::defunit;
}